

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_surjectionproof_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,
              secp256k1_surjectionproof *proof)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  long lVar3;
  
  if (output == (uchar *)0x0) {
    secp256k1_surjectionproof_serialize_cold_3();
  }
  else if (outputlen == (size_t *)0x0) {
    secp256k1_surjectionproof_serialize_cold_2();
  }
  else {
    if (proof != (secp256k1_surjectionproof *)0x0) {
      uVar2 = proof->n_inputs + 7;
      uVar1 = uVar2 >> 3;
      __n = 0x20;
      if (7 < uVar2) {
        uVar2 = 0;
        lVar3 = 0;
        do {
          lVar3 = lVar3 + (ulong)(((uint)proof->used_inputs[uVar2] * 0x8040201 >> 3 & 0x11111111) *
                                  0x11111111 >> 0x1c);
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
        __n = lVar3 * 0x20 + 0x20;
      }
      uVar2 = uVar1 + __n + 2;
      if (*outputlen < uVar2) {
        return 0;
      }
      *output = (uchar)proof->n_inputs;
      output[1] = *(uchar *)((long)&proof->n_inputs + 1);
      memcpy(output + 2,proof->used_inputs,proof->n_inputs + 7 >> 3);
      memcpy(output + (proof->n_inputs + 7 >> 3) + 2,proof->data,__n);
      *outputlen = uVar2;
      return 1;
    }
    secp256k1_surjectionproof_serialize_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_surjectionproof_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_surjectionproof *proof) {
    size_t signature_len;
    size_t serialized_len;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(proof != NULL);
    (void) ctx;

    signature_len = 32 * (1 + secp256k1_count_bits_set(proof->used_inputs, (proof->n_inputs + 7) / 8));
    serialized_len = 2 + (proof->n_inputs + 7) / 8 + signature_len;
    if (*outputlen < serialized_len) {
        return 0;
    }

    output[0] = proof->n_inputs % 0x100;
    output[1] = proof->n_inputs / 0x100;
    memcpy(&output[2], proof->used_inputs, (proof->n_inputs + 7) / 8);
    memcpy(&output[2 + (proof->n_inputs + 7) / 8], proof->data, signature_len);
    *outputlen = serialized_len;

    return 1;
}